

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
cleanAll(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
         *this)

{
  Lit *pLVar1;
  long lVar2;
  long lVar3;
  
  if (0 < (this->dirties).sz) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      pLVar1 = (this->dirties).data;
      if ((this->dirty).data[*(int *)((long)&pLVar1->x + lVar2)] != '\0') {
        clean(this,(Lit *)((long)&pLVar1->x + lVar2));
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 4;
    } while (lVar3 < (this->dirties).sz);
  }
  if ((this->dirties).data != (Lit *)0x0) {
    (this->dirties).sz = 0;
  }
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[toInt(dirties[i])])
            clean(dirties[i]);
    dirties.clear();
}